

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_accessBufferTest_Test::TestBody
          (OpenDDLParserTest_accessBufferTest_Test *this)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  char *buffer;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  long lVar8;
  char *in_R9;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  OpenDDLParser myParser;
  AssertHelper local_b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  string local_98;
  OpenDDLParser local_78;
  long lVar11;
  
  buffer = (char *)operator_new__(100);
  auVar3 = _DAT_00160d60;
  lVar8 = 0;
  auVar10 = _DAT_00164ab0;
  auVar12 = _DAT_00164ac0;
  auVar13 = _DAT_00164ad0;
  auVar14 = _DAT_00160d50;
  do {
    auVar16 = auVar14 ^ auVar3;
    iVar15 = auVar16._0_4_;
    iVar21 = auVar16._8_4_;
    auVar22._4_4_ = iVar15;
    auVar22._0_4_ = iVar15;
    auVar22._8_4_ = iVar21;
    auVar22._12_4_ = iVar21;
    auVar26._0_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar26._4_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar26._8_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar26._12_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar17._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar26;
    auVar16 = pshuflw(auVar22,auVar17,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    cVar7 = (char)lVar8;
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      buffer[lVar8] = cVar7;
    }
    auVar16 = packssdw(auVar17,auVar17);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
      buffer[lVar8 + 1] = cVar7 + '\x01';
    }
    auVar16 = auVar13 ^ auVar3;
    iVar15 = auVar16._0_4_;
    iVar21 = auVar16._8_4_;
    auVar23._4_4_ = iVar15;
    auVar23._0_4_ = iVar15;
    auVar23._8_4_ = iVar21;
    auVar23._12_4_ = iVar21;
    auVar27._0_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar27._4_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar27._8_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar27._12_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar18._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar27;
    auVar16 = packssdw(auVar23,auVar18);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      buffer[lVar8 + 2] = cVar7 + '\x02';
    }
    auVar16 = pshufhw(auVar18,auVar18,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      buffer[lVar8 + 3] = cVar7 + '\x03';
    }
    auVar16 = auVar12 ^ auVar3;
    iVar15 = auVar16._0_4_;
    iVar21 = auVar16._8_4_;
    auVar24._4_4_ = iVar15;
    auVar24._0_4_ = iVar15;
    auVar24._8_4_ = iVar21;
    auVar24._12_4_ = iVar21;
    auVar28._0_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar28._4_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar28._8_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar28._12_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar19._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar28;
    auVar16 = pshuflw(auVar24,auVar19,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      buffer[lVar8 + 4] = cVar7 + '\x04';
    }
    auVar16 = packssdw(auVar19,auVar19);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      buffer[lVar8 + 5] = cVar7 + '\x05';
    }
    auVar16 = auVar10 ^ auVar3;
    iVar15 = auVar16._0_4_;
    iVar21 = auVar16._8_4_;
    auVar25._4_4_ = iVar15;
    auVar25._0_4_ = iVar15;
    auVar25._8_4_ = iVar21;
    auVar25._12_4_ = iVar21;
    auVar29._0_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar29._4_4_ = -(uint)(iVar15 < -0x7fffff9c);
    auVar29._8_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar29._12_4_ = -(uint)(iVar21 < -0x7fffff9c);
    auVar20._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar29;
    auVar16 = packssdw(auVar25,auVar20);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      buffer[lVar8 + 6] = cVar7 + '\x06';
    }
    auVar16 = pshufhw(auVar20,auVar20,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      buffer[lVar8 + 7] = cVar7 + '\a';
    }
    lVar8 = lVar8 + 8;
    lVar11 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 8;
    auVar14._8_8_ = lVar11 + 8;
    lVar11 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 8;
    auVar13._8_8_ = lVar11 + 8;
    lVar11 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 8;
    auVar12._8_8_ = lVar11 + 8;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 8;
    auVar10._8_8_ = lVar11 + 8;
  } while (lVar8 != 0x68);
  OpenDDLParser::OpenDDLParser(&local_78);
  OpenDDLParser::setBuffer(&local_78,buffer,100);
  local_b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::getBufferSize(&local_78);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"len","myParser.getBufferSize()",&TestBody::len,
             (unsigned_long *)&local_b0);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xb0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = OpenDDLParser::getBuffer(&local_78);
  uVar9 = 0;
  while( true ) {
    sVar6 = OpenDDLParser::getBufferSize(&local_78);
    if ((100 < uVar9) || (sVar6 <= uVar9)) break;
    pcVar1 = buffer + uVar9;
    pcVar2 = pcVar5 + uVar9;
    uVar9 = uVar9 + 1;
    if (*pcVar1 != *pcVar2) {
      local_b0.ptr_._0_1_ = (internal)0x0;
LAB_001414be:
      local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_98,(internal *)&local_b0,(AssertionResult *)"equal","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0xbd,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                        (char)local_98._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
          &local_98.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p),
                        local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_b8.data_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_b8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b8.data_ + 8))();
        }
      }
LAB_00141560:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      OpenDDLParser::clear(&local_78);
      buffer[1] = 'c';
      local_b0.ptr_._0_1_ = (internal)0x1;
      local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      OpenDDLParser::setBuffer(&local_78,buffer,100);
      OpenDDLParser::clear(&local_78);
      local_b8.data_ = (AssertHelperData *)((ulong)local_b8.data_._4_4_ << 0x20);
      local_b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OpenDDLParser::getBufferSize(&local_78);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&local_98,"0U","myParser.getBufferSize()",(uint *)&local_b8,
                 (unsigned_long *)&local_b0);
      if ((char)local_98._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_98._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xca,pcVar5);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if (local_b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_98._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OpenDDLParser::getBuffer(&local_78);
      local_b8.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperEQ<char_const*,char_const*>
                ((internal *)&local_98,"nullptr","myParser.getBuffer()",(char **)&local_b8,
                 (char **)&local_b0);
      if ((char)local_98._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_98._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0xcb,pcVar5);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if (local_b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_98._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      operator_delete__(buffer);
      OpenDDLParser::~OpenDDLParser(&local_78);
      return;
    }
  }
  local_b0.ptr_._0_1_ = (internal)(sVar6 <= uVar9);
  local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0.ptr_._0_1_) goto LAB_001414be;
  goto LAB_00141560;
}

Assistant:

TEST_F(OpenDDLParserTest, accessBufferTest) {
    static const size_t len = 100;
    char *buffer = new char[len];
    for (size_t i = 0; i < len; i++) {
        buffer[i] = (char)i;
    }
    OpenDDLParser myParser;
    myParser.setBuffer(buffer, len);
    EXPECT_EQ(len, myParser.getBufferSize());
    bool equal(true);
    const char *parserBuffer(myParser.getBuffer());
    for (size_t i = 0; i < myParser.getBufferSize(); i++) {
        if (i > len) {
            equal = false;
            break;
        }
        if (buffer[i] != parserBuffer[i]) {
            equal = false;
            break;
        }
    }
    EXPECT_TRUE(equal);

    bool success(true);
    try {
        myParser.clear();
        buffer[1] = 'c';
    } catch (...) {
        success = false;
    }
    EXPECT_TRUE(success);

    myParser.setBuffer(buffer, len);
    myParser.clear();
    EXPECT_EQ(0U, myParser.getBufferSize());
    EXPECT_EQ(nullptr, myParser.getBuffer());
    delete[] buffer;
}